

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingTest.cpp
# Opt level: O0

void writeUData(XMLCh *s)

{
  XMLSize_t XVar1;
  XMLCh c;
  size_t len;
  uint i;
  XMLCh *s_local;
  
  printf("<udata>\n");
  XVar1 = xercesc_4_0::XMLString::stringLen(s);
  for (len._4_4_ = 0; len._4_4_ < XVar1; len._4_4_ = len._4_4_ + 1) {
    if ((len._4_4_ & 0xf) == 0) {
      printf("\n");
    }
    printf("%4x ",(ulong)(ushort)s[len._4_4_]);
  }
  printf("\n</udata>\n");
  return;
}

Assistant:

static void writeUData(const XMLCh* s)
{
    unsigned int i;
    printf("<udata>\n");
    size_t len = XMLString::stringLen(s);
    for (i=0; i<len; i++)
    {
        if (i % 16 == 0)
            printf("\n");
        XMLCh c = s[i];
        printf("%4x ", c);
    }
    printf("\n</udata>\n");
}